

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O0

void __thiscall
ReadOnlyStringCallback::ReadOnlyStringCallback
          (ReadOnlyStringCallback *this,SortableOIDType *oid,string *value)

{
  string *value_local;
  SortableOIDType *oid_local;
  ReadOnlyStringCallback *this_local;
  
  ValueCallback::ValueCallback(&this->super_ValueCallback,oid,STRING);
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_0028fa60;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

ReadOnlyStringCallback(SortableOIDType* oid, const std::string &value): ValueCallback(oid, STRING), value(value) {}